

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_make_env_op(sexp ctx,sexp self,sexp_sint_t n)

{
  sexp psVar1;
  size_t in_RDX;
  sexp in_RSI;
  sexp e;
  sexp_uint_t in_stack_ffffffffffffffe0;
  
  psVar1 = sexp_alloc_tagged_aux(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  (psVar1->value).type.cpl = (sexp)0x0;
  (psVar1->value).flonum = 0.0;
  (psVar1->value).uvector.length = 0x23e;
  (psVar1->value).bytecode.length = 0x23e;
  return psVar1;
}

Assistant:

sexp sexp_make_env_op (sexp ctx, sexp self, sexp_sint_t n) {
  sexp e = sexp_alloc_type(ctx, env, SEXP_ENV);
  sexp_env_lambda(e) = NULL;
  sexp_env_parent(e) = NULL;
  sexp_env_bindings(e) = SEXP_NULL;
#if SEXP_USE_STABLE_ABI || SEXP_USE_RENAME_BINDINGS
  sexp_env_renames(e) = SEXP_NULL;
#endif
  return e;
}